

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O1

void Aig_ManRandomTest1(void)

{
  FILE *__stream;
  ulong uVar1;
  uint uVar2;
  
  __stream = fopen("rand.txt","w");
  uVar1 = 1;
  do {
    Aig_ManRandom::m_z = (Aig_ManRandom::m_z >> 0x10) + (Aig_ManRandom::m_z & 0xffff) * 0x9069;
    Aig_ManRandom::m_w = (Aig_ManRandom::m_w >> 0x10) + (Aig_ManRandom::m_w & 0xffff) * 18000;
    uVar2 = Aig_ManRandom::m_z * 0x10000 + Aig_ManRandom::m_w;
    fprintf(__stream,"%10d : %10d ",uVar1,(ulong)uVar2);
    fputc(10,__stream);
    if ((int)uVar1 == 20000) break;
    uVar1 = (ulong)((int)uVar1 + 1);
  } while (uVar2 != 1);
  fclose(__stream);
  return;
}

Assistant:

void Aig_ManRandomTest1()
{
    FILE * pFile;
    unsigned int lfsr;
    unsigned int period = 0; 
    pFile = fopen( "rand.txt", "w" );
    do {
        lfsr = Aig_ManRandom( 0 );
        ++period;
        fprintf( pFile, "%10d : %10d ", period, lfsr );
//        Extra_PrintBinary( pFile, &lfsr, 32 );
        fprintf( pFile, "\n" );
        if ( period == 20000 )
            break;
    } while(lfsr != 1u);
    fclose( pFile );
}